

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v_07;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue promise;
  JSValue JVar1;
  int iVar2;
  undefined4 *opaque;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSValue error;
  JSValue ret2;
  int i;
  JSValue ret;
  JSValue args [2];
  JSPromiseData *s;
  JSValue obj;
  JSValue executor;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  JSValueUnion in_stack_fffffffffffffed8;
  JSValueUnion in_stack_fffffffffffffee0;
  JSContext *in_stack_fffffffffffffee8;
  int64_t iVar5;
  JSValueUnion local_110;
  int argc_00;
  JSContext *in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  JSValue *in_stack_ffffffffffffff10;
  JSValueUnion JVar6;
  JSContext *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff24;
  int64_t in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff30 [16];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar8;
  uint in_stack_ffffffffffffff44;
  JSValueUnion in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  int64_t local_a8;
  int local_9c;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  JVar3.tag = (int64_t)in_stack_fffffffffffffee8;
  JVar3.u.float64 = in_stack_fffffffffffffee0.float64;
  iVar2 = check_function((JSContext *)in_stack_fffffffffffffed8.ptr,JVar3);
  if (iVar2 != 0) {
    local_10 = 0;
    local_8 = 6;
    goto LAB_0014d019;
  }
  JVar4.tag = in_stack_ffffffffffffff50;
  JVar4.u.float64 = in_stack_ffffffffffffff48.float64;
  JVar3 = js_create_from_ctor((JSContext *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),JVar4,
                              in_stack_ffffffffffffff30._12_4_);
  local_a8 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 != 0) {
    local_10 = 0;
    local_8 = 6;
    goto LAB_0014d019;
  }
  opaque = (undefined4 *)js_mallocz(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
  if (opaque != (undefined4 *)0x0) {
    *opaque = 0;
    opaque[10] = 0;
    for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
      init_list_head((list_head *)(opaque + (long)local_9c * 4 + 2));
    }
    uVar8 = 0;
    *(ulong *)(opaque + 0xc) = (ulong)in_stack_ffffffffffffff44 << 0x20;
    *(undefined8 *)(opaque + 0xe) = 3;
    JS_SetOpaque(JVar3,opaque);
    promise.u._4_4_ = in_stack_ffffffffffffff24;
    promise.u.int32 = in_stack_ffffffffffffff20;
    promise.tag = in_stack_ffffffffffffff28;
    iVar2 = js_create_resolving_functions
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,promise);
    if (iVar2 == 0) {
      uVar7 = 0;
      func_obj.tag._0_4_ = 0;
      func_obj.u.ptr = in_stack_ffffffffffffff18;
      func_obj.tag._4_4_ = in_stack_ffffffffffffff24;
      this_obj.tag = (int64_t)in_stack_ffffffffffffff10;
      this_obj.u.float64 = in_stack_ffffffffffffff08.float64;
      JVar4 = JS_Call(in_stack_ffffffffffffff00,func_obj,this_obj,argc_00,
                      (JSValue *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
      iVar2 = JS_IsException(JVar4);
      if (iVar2 != 0) {
        JVar4 = JS_GetException(in_RDI);
        local_110 = JVar4.u;
        in_stack_fffffffffffffed0 = 0;
        in_stack_fffffffffffffed8.float64 = 1.48219693752374e-323;
        func_obj_00.tag._0_4_ = uVar7;
        func_obj_00.u.ptr = in_stack_ffffffffffffff18;
        func_obj_00.tag._4_4_ = in_stack_ffffffffffffff24;
        this_obj_00.tag = (int64_t)in_stack_ffffffffffffff10;
        this_obj_00.u = (JSValueUnion)(JSValueUnion)JVar4.tag;
        argc_00 = JVar4.tag._4_4_;
        JVar4 = JS_Call((JSContext *)local_110.ptr,func_obj_00,this_obj_00,argc_00,
                        (JSValue *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
        in_stack_fffffffffffffee0 = JVar4.u;
        iVar5 = JVar4.tag;
        v.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
        v.u.ptr = in_stack_fffffffffffffed8.ptr;
        JVar6 = in_stack_fffffffffffffee0;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v);
        v_07.tag = iVar5;
        v_07.u.ptr = JVar6.ptr;
        iVar2 = JS_IsException(v_07);
        if (iVar2 != 0) {
          v_04.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
          v_04.u.ptr = in_stack_fffffffffffffed8.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       v_04);
          v_05.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
          v_05.u.ptr = in_stack_fffffffffffffed8.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       v_05);
          goto LAB_0014cfe5;
        }
        v_00.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
        v_00.u.ptr = in_stack_fffffffffffffed8.ptr;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v_00
                    );
      }
      v_01.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
      v_01.u.ptr = in_stack_fffffffffffffed8.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v_01);
      v_02.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
      v_02.u.ptr = in_stack_fffffffffffffed8.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v_02);
      v_03.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
      v_03.u.ptr = in_stack_fffffffffffffed8.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v_03);
      local_10 = JVar3.u._0_4_;
      uStack_c = JVar3.u._4_4_;
      local_8 = local_a8;
      goto LAB_0014d019;
    }
  }
LAB_0014cfe5:
  v_06.tag = (int64_t)in_stack_fffffffffffffee0.ptr;
  v_06.u.ptr = in_stack_fffffffffffffed8.ptr;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),v_06);
  local_10 = 0;
  local_8 = 6;
LAB_0014d019:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_promise_constructor(JSContext *ctx, JSValueConst new_target,
                                      int argc, JSValueConst *argv)
{
    JSValueConst executor;
    JSValue obj;
    JSPromiseData *s;
    JSValue args[2], ret;
    int i;

    executor = argv[0];
    if (check_function(ctx, executor))
        return JS_EXCEPTION;
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_PROMISE);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->promise_state = JS_PROMISE_PENDING;
    s->is_handled = FALSE;
    for(i = 0; i < 2; i++)
        init_list_head(&s->promise_reactions[i]);
    s->promise_result = JS_UNDEFINED;
    JS_SetOpaque(obj, s);
    if (js_create_resolving_functions(ctx, args, obj))
        goto fail;
    ret = JS_Call(ctx, executor, JS_UNDEFINED, 2, (JSValueConst *)args);
    if (JS_IsException(ret)) {
        JSValue ret2, error;
        error = JS_GetException(ctx);
        ret2 = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret2))
            goto fail1;
        JS_FreeValue(ctx, ret2);
    }
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return obj;
 fail1:
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}